

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void absl::ForgetSynchEvent(atomic<long> *addr,intptr_t bits,intptr_t lockbit)

{
  int iVar1;
  int *v;
  int *piVar2;
  int *piVar3;
  
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  piVar2 = (int *)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  do {
    piVar3 = piVar2;
    v = *(int **)piVar3;
    if (v == (int *)0x0) {
      AtomicClearBits(addr,bits,lockbit);
      base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
      return;
    }
    piVar2 = v + 2;
  } while ((*(ulong *)(v + 4) ^ (ulong)addr) != 0xf03a5f7bf03a5f7b);
  *(undefined8 *)piVar3 = *(undefined8 *)(v + 2);
  *v = *v + -1;
  iVar1 = *v;
  AtomicClearBits(addr,bits,lockbit);
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  if (iVar1 != 0) {
    return;
  }
  base_internal::LowLevelAlloc::Free(v);
  return;
}

Assistant:

static void ForgetSynchEvent(std::atomic<intptr_t> *addr, intptr_t bits,
                             intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent **pe;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (pe = &synch_event[h];
       (e = *pe) != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       pe = &e->next) {
  }
  bool del = false;
  if (e != nullptr) {
    *pe = e->next;
    del = (--(e->refcount) == 0);
  }
  AtomicClearBits(addr, bits, lockbit);
  synch_event_mu.Unlock();
  if (del) {
    DeleteSynchEvent(e);
  }
}